

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int fits_img_stats_float
              (float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngoodpix,
              float *minvalue,float *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  float fVar1;
  long lVar2;
  void *__ptr;
  double *__base;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t __nmemb;
  long lVar9;
  float *pfVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  long ngood;
  double *local_70;
  double local_68;
  float maxval;
  float minval;
  long local_58;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  long *local_38;
  
  xnoise2 = 0.0;
  xnoise3 = 0.0;
  xnoise5 = 0.0;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    lVar2 = ny * nx;
    if (nullcheck == 0) {
      if (0 < lVar2) {
        dVar12 = 0.0;
        lVar5 = 0;
        dVar14 = 0.0;
        do {
          dVar13 = (double)array[lVar5];
          dVar14 = dVar14 + dVar13;
          dVar12 = dVar12 + dVar13 * dVar13;
          lVar5 = lVar5 + 1;
          lVar7 = lVar2;
        } while (lVar2 - lVar5 != 0);
        goto LAB_001fa6c3;
      }
LAB_001fa713:
      ngood = 0;
      dVar14 = 0.0;
      lVar7 = 0;
      dVar12 = 0.0;
    }
    else {
      if (lVar2 < 1) goto LAB_001fa713;
      dVar12 = 0.0;
      lVar7 = 0;
      dVar14 = 0.0;
      lVar5 = 0;
      do {
        fVar11 = array[lVar5];
        if ((fVar11 != nullvalue) || (NAN(fVar11) || NAN(nullvalue))) {
          lVar7 = lVar7 + 1;
          dVar13 = (double)fVar11;
          dVar14 = dVar14 + dVar13;
          dVar12 = dVar12 + dVar13 * dVar13;
        }
        lVar5 = lVar5 + 1;
      } while (lVar2 - lVar5 != 0);
LAB_001fa6c3:
      if (lVar7 < 2) {
        if (lVar7 != 1) goto LAB_001fa713;
        ngood = 1;
        dVar12 = 0.0;
        lVar7 = 1;
      }
      else {
        dVar14 = dVar14 / (double)lVar7;
        dVar12 = dVar12 / (double)lVar7 - dVar14 * dVar14;
        ngood = lVar7;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = lVar7;
    }
    if (mean != (double *)0x0) {
      *mean = dVar14;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar12;
    }
  }
  if (noise1 == (double *)0x0) goto LAB_001fabfd;
  dVar12 = 0.0;
  if (2 < nx) {
    __ptr = calloc(nx,4);
    if (__ptr != (void *)0x0) {
      __base = (double *)calloc(ny,8);
      if (__base != (double *)0x0) {
        if (ny < 1) {
          dVar12 = 0.0;
        }
        else {
          lVar2 = nx * 4;
          __nmemb = 0;
          lVar5 = 0;
          pfVar10 = array;
          local_70 = __base;
          local_58 = lVar2;
          local_38 = ngoodpix;
          do {
            lVar7 = 0;
            if (nullcheck == 0) {
LAB_001fa86b:
              if ((lVar7 != nx) && (lVar9 = lVar7 + 1, lVar9 < nx)) {
                uVar4 = 0;
                fVar11 = array[lVar5 * nx + lVar7];
                do {
                  if ((nullcheck != 0) && (lVar9 < nx)) {
                    while( true ) {
                      if ((pfVar10[lVar9] != nullvalue) || (NAN(pfVar10[lVar9]) || NAN(nullvalue)))
                      break;
                      lVar9 = lVar9 + 1;
                      if (nx == lVar9) goto LAB_001fa8dc;
                    }
                  }
                  if (lVar9 == nx) break;
                  fVar1 = array[lVar5 * nx + lVar9];
                  *(float *)((long)__ptr + uVar4 * 4) = fVar11 - fVar1;
                  uVar4 = uVar4 + 1;
                  lVar9 = lVar9 + 1;
                  fVar11 = fVar1;
                } while (lVar9 < nx);
LAB_001fa8dc:
                if (1 < uVar4) {
                  dVar14 = 0.0;
                  dVar12 = 0.0;
                  uVar3 = 0;
                  do {
                    dVar13 = (double)*(float *)((long)__ptr + uVar3 * 4);
                    dVar12 = dVar12 + dVar13;
                    dVar14 = dVar14 + dVar13 * dVar13;
                    uVar3 = uVar3 + 1;
                  } while (uVar4 != uVar3);
                  dVar12 = dVar12 / (double)(long)uVar4;
                  dVar14 = dVar14 / (double)(long)uVar4 - dVar12 * dVar12;
                  if (dVar14 < 0.0) {
                    local_68 = dVar12;
                    dVar14 = sqrt(dVar14);
                    __base = local_70;
                    lVar2 = local_58;
                    dVar12 = local_68;
                  }
                  else {
                    dVar14 = SQRT(dVar14);
                  }
                  if (0.0 < dVar14) {
                    iVar6 = 0;
                    do {
                      if ((long)uVar4 < 1) {
                        if (uVar4 == 0) break;
                        uVar8 = 0;
LAB_001fa9b1:
                        dVar14 = 0.0;
                        dVar12 = 0.0;
                      }
                      else {
                        uVar3 = 0;
                        uVar8 = 0;
                        do {
                          fVar11 = *(float *)((long)__ptr + uVar3 * 4);
                          if (ABS((double)fVar11 - dVar12) < dVar14 * 5.0) {
                            if ((long)uVar8 < (long)uVar3) {
                              *(float *)((long)__ptr + uVar8 * 4) = fVar11;
                            }
                            uVar8 = uVar8 + 1;
                          }
                          uVar3 = uVar3 + 1;
                        } while (uVar4 != uVar3);
                        if (uVar8 == uVar4) break;
                        if ((long)uVar8 < 1) goto LAB_001fa9b1;
                        dVar14 = 0.0;
                        dVar12 = 0.0;
                        uVar4 = 0;
                        do {
                          dVar13 = (double)*(float *)((long)__ptr + uVar4 * 4);
                          dVar12 = dVar12 + dVar13;
                          dVar14 = dVar14 + dVar13 * dVar13;
                          uVar4 = uVar4 + 1;
                        } while (uVar8 != uVar4);
                        if (uVar8 == 1) {
                          dVar14 = 0.0;
                          uVar8 = 1;
                        }
                        else {
                          dVar12 = dVar12 / (double)(long)uVar8;
                          dVar14 = dVar14 / (double)(long)uVar8 - dVar12 * dVar12;
                          if (dVar14 < 0.0) {
                            local_68 = dVar12;
                            dVar14 = sqrt(dVar14);
                            __base = local_70;
                            lVar2 = local_58;
                            dVar12 = local_68;
                          }
                          else {
                            dVar14 = SQRT(dVar14);
                          }
                        }
                      }
                      iVar6 = iVar6 + 1;
                      uVar4 = uVar8;
                    } while (iVar6 != 3);
                  }
                  __base[__nmemb] = dVar14;
                  __nmemb = __nmemb + 1;
                  ngoodpix = local_38;
                }
              }
            }
            else {
              do {
                if ((pfVar10[lVar7] != nullvalue) || (NAN(pfVar10[lVar7]) || NAN(nullvalue)))
                goto LAB_001fa86b;
                lVar7 = lVar7 + 1;
              } while (nx != lVar7);
            }
            lVar5 = lVar5 + 1;
            pfVar10 = (float *)((long)pfVar10 + lVar2);
          } while (lVar5 != ny);
          if (__nmemb == 0) {
            dVar12 = 0.0;
          }
          else if (__nmemb == 1) {
            dVar12 = *__base;
          }
          else {
            qsort(__base,__nmemb,8,FnCompare_double);
            dVar12 = (*(double *)
                       ((long)local_70 +
                       ((__nmemb - ((long)(__nmemb - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                     *(double *)
                      ((long)local_70 + (__nmemb - ((long)__nmemb >> 0x3f) & 0xfffffffffffffffe) * 4
                      )) * 0.5;
            __base = local_70;
          }
        }
        dVar12 = dVar12 * 0.70710678;
        free(__base);
        free(__ptr);
        goto LAB_001fabf9;
      }
      free(__ptr);
    }
    *status = 0x71;
    dVar12 = 0.0;
  }
LAB_001fabf9:
  *noise1 = dVar12;
LAB_001fabfd:
  if ((minvalue != (float *)0x0 || maxvalue != (float *)0x0) || noise3 != (double *)0x0) {
    FnNoise5_float(array,nx,ny,nullcheck,nullvalue,&ngood,&minval,&maxval,&xnoise2,&xnoise3,&xnoise5
                   ,status);
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = ngood;
    }
    if (minvalue != (float *)0x0) {
      *minvalue = minval;
    }
    if (maxvalue != (float *)0x0) {
      *maxvalue = maxval;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = xnoise2;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = xnoise3;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = xnoise5;
    }
  }
  return *status;
}

Assistant:

int fits_img_stats_float(float *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	float *minvalue,    /* returned minimum non-null value in the array */
	float *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input float image.
*/
{
	long ngood;
	float minval, maxval;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_float(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_float(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_float(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}